

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  void *pvVar4;
  long lVar5;
  ulong MinSizeInBytes;
  void *__dest;
  
  if (this == RHS) {
    return this;
  }
  pvVar1 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar4 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  MinSizeInBytes = (long)pvVar4 - (long)pvVar1;
  __dest = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar2 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  sVar3 = (long)pvVar2 - (long)__dest;
  if (MinSizeInBytes <= sVar3) {
    sVar3 = (long)pvVar4 - (long)pvVar1;
    if (sVar3 != 0) {
      memmove(__dest,pvVar1,sVar3);
      __dest = (void *)((long)__dest + sVar3);
    }
    goto LAB_00136a2a;
  }
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                    super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX -
             (long)__dest) < MinSizeInBytes) {
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = __dest;
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,
               &(this->super_SmallVectorTemplateBase<int,_true>).
                super_SmallVectorTemplateCommon<int,_void>.FirstEl,MinSizeInBytes,4);
LAB_00136a00:
    lVar5 = 0;
  }
  else {
    if (pvVar2 == __dest) goto LAB_00136a00;
    lVar5 = (long)sVar3 >> 2;
    memmove(__dest,pvVar1,sVar3);
  }
  pvVar4 = (void *)((long)(RHS->super_SmallVectorTemplateBase<int,_true>).
                          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX +
                   lVar5 * 4);
  pvVar1 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  if (pvVar4 != pvVar1) {
    memcpy((void *)(lVar5 * 4 +
                   (long)(this->super_SmallVectorTemplateBase<int,_true>).
                         super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX),
           pvVar4,(long)pvVar1 - (long)pvVar4);
  }
  __dest = (void *)(MinSizeInBytes +
                   (long)(this->super_SmallVectorTemplateBase<int,_true>).
                         super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
LAB_00136a2a:
  (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.EndX = __dest;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}